

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::NetDeclarationSyntax::setChild
          (NetDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  SyntaxNode *pSVar2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *pSVar3;
  logic_error *this_00;
  Token TVar4;
  TimingControlSyntax *local_168;
  DataTypeSyntax *local_160;
  NetStrengthSyntax *local_158;
  string local_130;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined8 local_58;
  Info *local_50;
  DataTypeSyntax *local_48;
  DataTypeSyntax *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  NetDeclarationSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar2);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_MemberSyntax).attributes,pSVar1);
    break;
  case 1:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar4._0_8_;
    (this->netType).kind = (undefined2)local_28;
    (this->netType).field_0x2 = local_28._2_1_;
    (this->netType).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->netType).rawLen = local_28._4_4_;
    local_20 = TVar4.info;
    (this->netType).info = local_20;
    break;
  case 2:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_158 = (NetStrengthSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_158 = SyntaxNode::as<slang::syntax::NetStrengthSyntax>(pSVar2);
    }
    this->strength = local_158;
    break;
  case 3:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar4._0_8_;
    (this->expansionHint).kind = (undefined2)local_38;
    (this->expansionHint).field_0x2 = local_38._2_1_;
    (this->expansionHint).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->expansionHint).rawLen = local_38._4_4_;
    local_30 = TVar4.info;
    (this->expansionHint).info = local_30;
    break;
  case 4:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_160 = (DataTypeSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_160 = SyntaxNode::as<slang::syntax::DataTypeSyntax>(pSVar2);
    }
    local_48 = local_160;
    not_null<slang::syntax::DataTypeSyntax*>::not_null<slang::syntax::DataTypeSyntax*,void>
              ((not_null<slang::syntax::DataTypeSyntax*> *)&local_40,&local_48);
    (this->type).ptr = local_40;
    break;
  case 5:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_168 = (TimingControlSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_168 = SyntaxNode::as<slang::syntax::TimingControlSyntax>(pSVar2);
    }
    this->delay = local_168;
    break;
  case 6:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar3 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>>
                       (pSVar2);
    SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::operator=(&this->declarators,pSVar3);
    break;
  case 7:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_58 = TVar4._0_8_;
    (this->semi).kind = (undefined2)local_58;
    (this->semi).field_0x2 = local_58._2_1_;
    (this->semi).numFlags = (NumericTokenFlags)local_58._3_1_;
    (this->semi).rawLen = local_58._4_4_;
    local_50 = TVar4.info;
    (this->semi).info = local_50;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_f9);
    std::operator+(&local_d8,&local_f8,":");
    std::__cxx11::to_string(&local_130,0x22c9);
    std::operator+(&local_b8,&local_d8,&local_130);
    std::operator+(&local_98,&local_b8,": ");
    std::operator+(&local_78,&local_98,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_78);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void NetDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: netType = child.token(); return;
        case 2: strength = child.node() ? &child.node()->as<NetStrengthSyntax>() : nullptr; return;
        case 3: expansionHint = child.token(); return;
        case 4: type = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 5: delay = child.node() ? &child.node()->as<TimingControlSyntax>() : nullptr; return;
        case 6: declarators = child.node()->as<SeparatedSyntaxList<DeclaratorSyntax>>(); return;
        case 7: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}